

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestBufferStream(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  string junk;
  long local_1f0;
  undefined8 local_1e8;
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined8 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  const_string local_1b0;
  const_string local_1a0;
  ostream os;
  
  junk._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  junk._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  junk.field_2._M_allocated_capacity = 0x198;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&junk);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_1e0 = (undefined **)CONCAT71(local_1e0._1_7_,1);
  os.super_ostream._8_1_ = 0;
  os.super_ostream._vptr_basic_ostream = (_func_int **)&PTR__lazy_ostream_001ea9c8;
  os.super_ostream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  os.super_ostream._24_8_ = anon_var_dwarf_90ca1;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_1e0,(lazy_ostream *)&os);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_1e0);
  makeString_abi_cxx11_(&junk,0x1000);
  avro::ostream::ostream(&os);
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::operator<<(&os.super_ostream,(string *)&junk);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Buffer has ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," bytes\n");
  local_1a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1a0.m_end = "";
  local_1b0.m_begin = "";
  local_1b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)poVar1,&local_1a0,0x1a5,&local_1b0);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_001ea848;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1b8 = "";
  local_1e8 = *(undefined8 *)(os.super_ostream._72_8_ + 0xa8);
  local_1f0 = junk._M_string_length * 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_1e0,&local_1c0,0x1a5,1,2,&local_1e8,"buf.size()",&local_1f0,"junk.size() * i");
  avro::ostream::~ostream(&os);
  std::__cxx11::string::~string((string *)&junk);
  return;
}

Assistant:

void TestBufferStream()
{
    BOOST_TEST_MESSAGE( "TestBufferStream");

    {
        // write enough bytes to a buffer, to create at least 3 blocks
        std::string junk = makeString(kDefaultBlockSize);
        ostream os;
        int i = 0;
        for(; i < 3; ++i) {
            os << junk;
        }

        const OutputBuffer &buf = os.getBuffer();
        cout << "Buffer has " << buf.size() << " bytes\n";
        BOOST_CHECK_EQUAL(buf.size(), junk.size() * i);
    }
}